

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O3

void Fraig_TablePrintStatsF(Fraig_Man_t *pMan)

{
  Fraig_HashTable_t *pFVar1;
  int iVar2;
  Fraig_Node_t *pFVar3;
  int iVar4;
  long lVar5;
  
  pFVar1 = pMan->pTableF;
  printf("Functional table. Table size = %d. Number of entries = %d.\n",(ulong)(uint)pFVar1->nBins,
         (ulong)(uint)pFVar1->nEntries);
  iVar2 = pFVar1->nBins;
  if (0 < iVar2) {
    lVar5 = 0;
    do {
      pFVar3 = pFVar1->pBins[lVar5];
      if (pFVar3 != (Fraig_Node_t *)0x0) {
        iVar4 = 0;
        do {
          iVar4 = iVar4 + 1;
          pFVar3 = pFVar3->pNextF;
        } while (pFVar3 != (Fraig_Node_t *)0x0);
        if (iVar4 != 1) {
          printf("{%d} ");
          iVar2 = pFVar1->nBins;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar2);
  }
  putchar(10);
  return;
}

Assistant:

void Fraig_TablePrintStatsF( Fraig_Man_t * pMan )
{
    Fraig_HashTable_t * pT = pMan->pTableF;
    Fraig_Node_t * pNode;
    int i, Counter;

    printf( "Functional table. Table size = %d. Number of entries = %d.\n", pT->nBins, pT->nEntries );
    for ( i = 0; i < pT->nBins; i++ )
    {
        Counter = 0;
        Fraig_TableBinForEachEntryF( pT->pBins[i], pNode )
            Counter++;
        if ( Counter > 1 )
            printf( "{%d} ", Counter );
    }
    printf( "\n" );
}